

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

void __thiscall
PartialSphere_Reintersect_Test::~PartialSphere_Reintersect_Test
          (PartialSphere_Reintersect_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PartialSphere, Reintersect) {
    ParallelFor(0, nReintersect, [](int64_t i) {
        RNG rng(i);
        Transform identity;
        Float radius = pExp(rng, 4);
        Float zMin = rng.Uniform<Float>() < 0.5
                         ? -radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float zMax = rng.Uniform<Float>() < 0.5
                         ? radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float phiMax = rng.Uniform<Float>() < 0.5 ? 360. : rng.Uniform<Float>() * 360.;
        Sphere sphere(&identity, &identity, false, radius, zMin, zMax, phiMax);

        EXPECT_EQ(0, TestReintersectConvex(&sphere, rng)) << i;
    });
}